

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# math_test.cpp
# Opt level: O3

void __thiscall FloatInterval_SumSquares_Test::TestBody(FloatInterval_SumSquares_Test *this)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  bool bVar4;
  char *pcVar5;
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  AssertionResult gtest_ar;
  Message local_30;
  AssertHelper local_28;
  internal local_20 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_18;
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  undefined1 extraout_var_01 [56];
  
  local_30.ss_.ptr_._0_4_ = 1;
  local_28.data_._0_4_ = 1.0;
  testing::internal::CmpHelperEQ<int,float>
            (local_20,"1","Float(SumSquares(a))",(int *)&local_30,(float *)&local_28);
  if (local_20[0] == (internal)0x0) {
    testing::Message::Message(&local_30);
    if (local_18.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((local_18.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_28,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/math_test.cpp"
               ,0x30e,pcVar5);
    testing::internal::AssertHelper::operator=(&local_28,&local_30);
    testing::internal::AssertHelper::~AssertHelper(&local_28);
    if (CONCAT44(local_30.ss_.ptr_._4_4_,local_30.ss_.ptr_._0_4_) != 0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) &&
         ((long *)CONCAT44(local_30.ss_.ptr_._4_4_,local_30.ss_.ptr_._0_4_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_30.ss_.ptr_._4_4_,local_30.ss_.ptr_._0_4_) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_18,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_30.ss_.ptr_._0_4_ = 4;
  local_28.data_._0_4_ = 4.0;
  testing::internal::CmpHelperEQ<int,float>
            (local_20,"4","Float(SumSquares(b))",(int *)&local_30,(float *)&local_28);
  if (local_20[0] == (internal)0x0) {
    testing::Message::Message(&local_30);
    if (local_18.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((local_18.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_28,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/math_test.cpp"
               ,0x30f,pcVar5);
    testing::internal::AssertHelper::operator=(&local_28,&local_30);
    testing::internal::AssertHelper::~AssertHelper(&local_28);
    if (CONCAT44(local_30.ss_.ptr_._4_4_,local_30.ss_.ptr_._0_4_) != 0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) &&
         ((long *)CONCAT44(local_30.ss_.ptr_._4_4_,local_30.ss_.ptr_._0_4_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_30.ss_.ptr_._4_4_,local_30.ss_.ptr_._0_4_) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_18,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_30.ss_.ptr_._0_4_ = 5;
  auVar6._0_8_ = pbrt::FMA((Interval)0x3f8000003f800000,(Interval)0x3f8000003f800000,
                           (Interval)0x40800001407fffff);
  auVar6._8_56_ = extraout_var;
  auVar1 = vmaxss_avx(auVar6._0_16_,ZEXT816(0) << 0x40);
  auVar3 = vmovshdup_avx(auVar6._0_16_);
  auVar2 = vminss_avx(auVar3,auVar1);
  auVar1 = vmaxss_avx(auVar3,auVar1);
  local_28.data_._0_4_ = (auVar2._0_4_ + auVar1._0_4_) * 0.5;
  testing::internal::CmpHelperEQ<int,float>
            (local_20,"5","Float(SumSquares(a, b))",(int *)&local_30,(float *)&local_28);
  if (local_20[0] == (internal)0x0) {
    testing::Message::Message(&local_30);
    if (local_18.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((local_18.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_28,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/math_test.cpp"
               ,0x310,pcVar5);
    testing::internal::AssertHelper::operator=(&local_28,&local_30);
    testing::internal::AssertHelper::~AssertHelper(&local_28);
    if (CONCAT44(local_30.ss_.ptr_._4_4_,local_30.ss_.ptr_._0_4_) != 0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) &&
         ((long *)CONCAT44(local_30.ss_.ptr_._4_4_,local_30.ss_.ptr_._0_4_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_30.ss_.ptr_._4_4_,local_30.ss_.ptr_._0_4_) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_18,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_30.ss_.ptr_._0_4_ = 0xe;
  auVar7._0_8_ = pbrt::FMA((Interval)0x4000000040000000,(Interval)0x4000000040000000,
                           (Interval)0x41100001410fffff);
  auVar7._8_56_ = extraout_var_00;
  auVar1 = vmaxss_avx(auVar7._0_16_,ZEXT816(0) << 0x40);
  auVar3 = vmovshdup_avx(auVar7._0_16_);
  auVar2 = vminss_avx(auVar3,auVar1);
  auVar1 = vmaxss_avx(auVar3,auVar1);
  auVar1 = vinsertps_avx(auVar2,auVar1,0x10);
  auVar8._0_8_ = pbrt::FMA((Interval)0x3f8000003f800000,(Interval)0x3f8000003f800000,auVar1._0_8_);
  auVar8._8_56_ = extraout_var_01;
  auVar1 = vmaxss_avx(auVar8._0_16_,ZEXT416(0));
  auVar3 = vmovshdup_avx(auVar8._0_16_);
  auVar2 = vminss_avx(auVar3,auVar1);
  auVar1 = vmaxss_avx(auVar3,auVar1);
  local_28.data_._0_4_ = (auVar2._0_4_ + auVar1._0_4_) * 0.5;
  testing::internal::CmpHelperEQ<int,float>
            (local_20,"14","Float(SumSquares(a, b, c))",(int *)&local_30,(float *)&local_28);
  if (local_20[0] == (internal)0x0) {
    testing::Message::Message(&local_30);
    if (local_18.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((local_18.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_28,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/math_test.cpp"
               ,0x311,pcVar5);
    testing::internal::AssertHelper::operator=(&local_28,&local_30);
    testing::internal::AssertHelper::~AssertHelper(&local_28);
    if (CONCAT44(local_30.ss_.ptr_._4_4_,local_30.ss_.ptr_._0_4_) != 0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) &&
         ((long *)CONCAT44(local_30.ss_.ptr_._4_4_,local_30.ss_.ptr_._0_4_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_30.ss_.ptr_._4_4_,local_30.ss_.ptr_._0_4_) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_18,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  return;
}

Assistant:

TEST(FloatInterval, SumSquares) {
    {
        Interval a(1), b(2), c(3);
        EXPECT_EQ(1, Float(SumSquares(a)));
        EXPECT_EQ(4, Float(SumSquares(b)));
        EXPECT_EQ(5, Float(SumSquares(a, b)));
        EXPECT_EQ(14, Float(SumSquares(a, b, c)));
    }
}